

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::insert_internal(tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *this,key_type k,value_view v,bool bypass_verifier)

{
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_00;
  value_view v_00;
  bool bVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_01;
  AssertionResult *this_02;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_bool>
  pVar3;
  undefined1 local_170 [8];
  inode_type_counter_array growing_inodes_before;
  inode_type_counter_array shrinking_inodes_before;
  node_type_counter_array node_counts_before;
  uint64_t key_prefix_splits_before;
  undefined1 local_b8 [8];
  value_view v_local;
  size_t mem_use_before;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  value_type leaf_count_after;
  undefined1 auStack_80 [7];
  bool empty_before;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  size_t mem_use_after;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertionResult gtest_ar_;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  local_b8 = (undefined1  [8])v._M_ptr;
  this_00 = &this->test_db;
  leaf_count_after._7_1_ =
       mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::empty(this_00);
  if (this->parallel_test == false) {
    v_local._M_extent._M_extent_value =
         mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
         get_current_memory_use(this_00);
  }
  else {
    v_local._M_extent._M_extent_value = 0;
  }
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_node_counts
            ((node_type_counter_array *)(shrinking_inodes_before._M_elems + 3),this_00);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  get_growing_inode_counts((inode_type_counter_array *)local_170,this_00);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  get_shrinking_inode_counts
            ((inode_type_counter_array *)(growing_inodes_before._M_elems + 3),this_00);
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
  get_key_prefix_splits(this_00);
  v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
  v_00._M_ptr = (pointer)local_b8;
  tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  do_insert<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)this,k,v_00);
  bVar1 = mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::empty
                    (this_00);
  local_48._M_head_impl._0_1_ = !bVar1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar1) {
    this_02 = &gtest_ar_;
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_80,(internal *)&local_48,(AssertionResult *)"test_db.empty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x18b,_auStack_80);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)_auStack_80 != &gtest_ar.message_) {
      operator_delete(_auStack_80,
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    gtest_ar._0_8_ = gtest_ar_._0_8_;
    if (gtest_ar_._0_8_ == 0) {
      return;
    }
    goto LAB_0014c6ad;
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
       get_current_memory_use(this_00);
  if (this->parallel_test == true) {
    local_48._M_head_impl = local_48._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)auStack_80,"(mem_use_after)","(0)",(unsigned_long *)&local_58,
               (int *)&local_48);
    if (auStack_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,400,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_48);
      goto LAB_0014c612;
    }
LAB_0014c390:
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
         get_node_count<(unodb::node_type)0>(this_00);
    if (this->parallel_test == true) {
      local_48._M_head_impl = local_48._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperGT<unsigned_long,int>
                ((internal *)auStack_80,"(leaf_count_after)","(0)",(unsigned_long *)&local_90,
                 (int *)&local_48);
      if (auStack_80[0] != (internal)0x0) {
LAB_0014c463:
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        if (bypass_verifier) {
          return;
        }
        allocation_failure_injector::fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i
             = (__atomic_base<unsigned_long>)0;
        allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)0;
        *(undefined1 *)(in_FS_OFFSET + -8) = 1;
        _auStack_80 = (pointer)k;
        pVar3 = std::
                map<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                ::try_emplace<std::span<std::byte_const,18446744073709551615ul>&>
                          ((map<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                            *)&this->values,(key_type *)auStack_80,
                           (span<const_std::byte,_18446744073709551615UL> *)local_b8);
        local_48._M_head_impl._0_1_ = pVar3.second;
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          testing::Message::Message((Message *)&local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)auStack_80,(internal *)&local_48,
                     (AssertionResult *)"insert_succeeded","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&mem_use_before,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x1a4,_auStack_80);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&mem_use_before,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem_use_before);
          if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)_auStack_80 != &gtest_ar.message_) {
            operator_delete(_auStack_80,
                            (long)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 1);
          }
          if (local_98._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_98._M_head_impl + 8))();
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
        }
        *(undefined1 *)(in_FS_OFFSET + -8) = 0;
        return;
      }
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x197,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_48);
    }
    else {
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (shrinking_inodes_before._M_elems[3] + 1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)auStack_80,"(leaf_count_after)",
                 "(node_counts_before[as_i<unodb::node_type::LEAF>] + 1)",(unsigned_long *)&local_90
                 ,(unsigned_long *)&local_48);
      if (auStack_80[0] != (internal)0x0) goto LAB_0014c463;
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x19a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_48);
    }
    this_01 = &local_98;
  }
  else {
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)auStack_80,"(mem_use_before)","(mem_use_after)",
               &v_local._M_extent._M_extent_value,(unsigned_long *)&local_58);
    if (auStack_80[0] != (internal)0x0) goto LAB_0014c390;
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x192,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_48);
LAB_0014c612:
    this_01 = &local_90;
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  if (gtest_ar._0_8_ == 0) {
    return;
  }
  this_02 = &gtest_ar;
LAB_0014c6ad:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_02,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_);
  return;
}

Assistant:

void insert_internal(key_type k, unodb::value_view v,
                       bool bypass_verifier = false) {
    const auto empty_before = test_db.empty();
#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_before =
        parallel_test ? 0 : test_db.get_current_memory_use();
    const auto node_counts_before = test_db.get_node_counts();
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      do_insert(k, v);
    } catch (...) {
      if (!parallel_test) {
        UNODB_ASSERT_EQ(empty_before, test_db.empty());
#ifdef UNODB_DETAIL_WITH_STATS
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
#endif  // UNODB_DETAIL_WITH_STATS
      }
      throw;
    }

    UNODB_ASSERT_FALSE(test_db.empty());

#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_after = test_db.get_current_memory_use();
    if (parallel_test)
      UNODB_ASSERT_GT(mem_use_after, 0);
    else
      UNODB_ASSERT_LT(mem_use_before, mem_use_after);

    const auto leaf_count_after =
        test_db.template get_node_count<unodb::node_type::LEAF>();
    if (parallel_test)
      UNODB_ASSERT_GT(leaf_count_after, 0);
    else
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] + 1);
#endif  // UNODB_DETAIL_WITH_STATS

    if (!bypass_verifier) {
#ifndef NDEBUG
      allocation_failure_injector::reset();
#endif
      UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
      const auto [pos, insert_succeeded] = values.try_emplace(to_ikey(k), v);
      (void)pos;
      UNODB_ASSERT_TRUE(insert_succeeded);
    }
  }